

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCut.c
# Opt level: O3

Gia_Man_t *
Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *p,Abc_Cex_t *pCex,Vec_Bit_t **pvInits,int iFrBeg,int iFrEnd)

{
  uint *puVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  char *__s;
  bool bVar4;
  Vec_Bit_t *pVVar5;
  int *__s_00;
  void *__s_01;
  Gia_Man_t *p_00;
  char *__dest;
  Gia_Obj_t *pGVar6;
  Gia_Man_t *pGVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  Vec_Int_t *pVVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  int iVar24;
  size_t sVar25;
  uint local_68;
  uint local_58;
  
  Gia_ManCleanMark0(p);
  uVar22 = p->nRegs;
  if ((int)uVar22 < 1) {
    local_58 = 0;
  }
  else {
    uVar11 = 0;
    do {
      iVar24 = p->vCis->nSize;
      local_58 = (uint)uVar11;
      uVar14 = (iVar24 - uVar22) + local_58;
      if (((int)uVar14 < 0) || (iVar24 <= (int)uVar14)) goto LAB_00521241;
      iVar24 = p->vCis->pArray[uVar14];
      lVar16 = (long)iVar24;
      if ((lVar16 < 0) || (p->nObjs <= iVar24)) goto LAB_00521222;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      local_58 = local_58 + 1;
      *(ulong *)(pGVar3 + lVar16) =
           *(ulong *)(pGVar3 + lVar16) & 0xffffffffbfffffff |
           (ulong)(((uint)(&pCex[1].iPo)[uVar11 >> 5] >> ((byte)uVar11 & 0x1f) & 1) << 0x1e);
      uVar22 = p->nRegs;
      uVar11 = (ulong)local_58;
    } while ((int)local_58 < (int)uVar22);
  }
  iVar24 = (((int)uVar22 >> 5) + 1) - (uint)((uVar22 & 0x1f) == 0);
  pVVar5 = (Vec_Bit_t *)malloc(0x10);
  pVVar5->nCap = iVar24 * 0x20;
  if (iVar24 == 0) {
    sVar25 = 0;
    __s_00 = (int *)0x0;
  }
  else {
    sVar25 = (long)iVar24 << 2;
    __s_00 = (int *)malloc(sVar25);
  }
  pVVar5->pArray = __s_00;
  pVVar5->nSize = iVar24 * 0x20;
  iVar24 = 0;
  memset(__s_00,0,sVar25);
  *pvInits = pVVar5;
  if (iFrEnd < 1) {
    if (iFrEnd != 0) {
      __assert_fail("i == iFrEnd",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexCut.c"
                    ,0x10b,
                    "Gia_Man_t *Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                   );
    }
  }
  else {
    do {
      if (iVar24 == iFrBeg) {
        pVVar12 = p->vCis;
        if (0 < (int)uVar22) {
          uVar14 = 0;
          do {
            uVar18 = (pVVar12->nSize - uVar22) + uVar14;
            if (((int)uVar18 < 0) || (pVVar12->nSize <= (int)uVar18)) goto LAB_00521241;
            iVar8 = pVVar12->pArray[uVar18];
            if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_00521222;
            if (p->pObjs == (Gia_Obj_t *)0x0) break;
            if ((p->pObjs[iVar8].field_0x3 & 0x40) != 0) {
              if ((*pvInits)->nSize <= (int)uVar14) goto LAB_00521339;
              puVar1 = (uint *)((*pvInits)->pArray + (uVar14 >> 5));
              *puVar1 = *puVar1 | 1 << ((byte)uVar14 & 0x1f);
              uVar22 = p->nRegs;
            }
            uVar14 = uVar14 + 1;
          } while ((int)uVar14 < (int)uVar22);
        }
      }
      else {
        pVVar12 = p->vCis;
      }
      uVar11 = (ulong)(uint)pVVar12->nSize;
      if ((int)uVar22 < pVVar12->nSize) {
        lVar16 = 0;
        do {
          if ((int)uVar11 <= lVar16) goto LAB_00521241;
          lVar23 = (long)pVVar12->pArray[lVar16];
          if ((lVar23 < 0) || (iVar8 = p->nObjs, iVar8 <= pVVar12->pArray[lVar16]))
          goto LAB_00521222;
          pGVar3 = p->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) {
            local_58 = local_58 + (int)lVar16;
            goto LAB_005204d5;
          }
          *(ulong *)(pGVar3 + lVar23) =
               *(ulong *)(pGVar3 + lVar23) & 0xffffffffbfffffff |
               (ulong)(((uint)(&pCex[1].iPo)[(int)((ulong)local_58 + lVar16) >> 5] >>
                        ((byte)((ulong)local_58 + lVar16) & 0x1f) & 1) << 0x1e);
          lVar16 = lVar16 + 1;
          pVVar12 = p->vCis;
          uVar11 = (ulong)pVVar12->nSize;
        } while (lVar16 < (long)(uVar11 - (long)p->nRegs));
        local_58 = local_58 + (int)lVar16;
      }
      iVar8 = p->nObjs;
      if (0 < iVar8) {
LAB_005204d5:
        lVar16 = 0;
        lVar23 = 0;
        do {
          pGVar3 = p->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          uVar11 = *(ulong *)(&pGVar3->field_0x0 + lVar16);
          if ((uVar11 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar11) {
            *(ulong *)(&pGVar3->field_0x0 + lVar16) =
                 uVar11 & 0xffffffff3fffffff |
                 (ulong)((((uint)(uVar11 >> 0x3d) ^
                          *(uint *)((long)pGVar3 +
                                   (ulong)((uint)(uVar11 >> 0x1e) & 0x7ffffffc) * -3 + lVar16) >>
                          0x1e) & ((uint)(uVar11 >> 0x1d) & 7 ^
                                  *(uint *)((long)pGVar3 +
                                           (ulong)(uint)((int)(uVar11 & 0x1fffffff) << 2) * -3 +
                                           lVar16) >> 0x1e) & 1) << 0x1e);
            iVar8 = p->nObjs;
          }
          lVar23 = lVar23 + 1;
          lVar16 = lVar16 + 0xc;
        } while (lVar23 < iVar8);
      }
      pVVar12 = p->vCos;
      if (0 < pVVar12->nSize) {
        lVar16 = 0;
        do {
          iVar8 = pVVar12->pArray[lVar16];
          if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_00521222;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar3 = p->pObjs + iVar8;
          uVar22 = (uint)*(ulong *)pGVar3;
          *(ulong *)pGVar3 =
               *(ulong *)pGVar3 & 0xffffffffbfffffff |
               (ulong)((uVar22 * 2 ^ *(uint *)(pGVar3 + -(ulong)(uVar22 & 0x1fffffff))) & 0x40000000
                      );
          lVar16 = lVar16 + 1;
          pVVar12 = p->vCos;
        } while (lVar16 < pVVar12->nSize);
      }
      uVar22 = p->nRegs;
      if (0 < (int)uVar22) {
        iVar8 = 0;
        do {
          iVar10 = p->vCos->nSize;
          uVar14 = (iVar10 - uVar22) + iVar8;
          if (((int)uVar14 < 0) || (iVar10 <= (int)uVar14)) goto LAB_00521241;
          iVar10 = p->vCos->pArray[uVar14];
          if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) goto LAB_00521222;
          pGVar3 = p->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          iVar2 = p->vCis->nSize;
          uVar22 = (iVar2 - uVar22) + iVar8;
          if (((int)uVar22 < 0) || (iVar2 <= (int)uVar22)) goto LAB_00521241;
          uVar22 = p->vCis->pArray[uVar22];
          lVar16 = (long)(int)uVar22;
          if ((lVar16 < 0) || ((uint)p->nObjs <= uVar22)) goto LAB_00521222;
          *(ulong *)(pGVar3 + lVar16) =
               *(ulong *)(pGVar3 + lVar16) & 0xffffffffbfffffff |
               (ulong)((uint)*(undefined8 *)(pGVar3 + iVar10) & 0x40000000);
          iVar8 = iVar8 + 1;
          uVar22 = p->nRegs;
        } while (iVar8 < (int)uVar22);
      }
      iVar24 = iVar24 + 1;
    } while (iVar24 != iFrEnd);
  }
  iVar24 = (((int)uVar22 >> 5) + 1) - (uint)((uVar22 & 0x1f) == 0);
  if (iVar24 == 0) {
    sVar25 = 0;
    __s_01 = (void *)0x0;
  }
  else {
    sVar25 = (long)iVar24 << 2;
    __s_01 = malloc(sVar25);
  }
  uVar14 = iVar24 * 0x20;
  uVar18 = 0;
  memset(__s_01,0,sVar25);
  if (0 < (int)uVar22) {
    pVVar12 = p->vCis;
    iVar24 = pVVar12->nSize;
    do {
      uVar9 = (iVar24 - uVar22) + uVar18;
      if (((int)uVar9 < 0) || (iVar24 <= (int)uVar9)) goto LAB_00521241;
      iVar8 = pVVar12->pArray[uVar9];
      if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_00521222;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if ((p->pObjs[iVar8].field_0x3 & 0x40) != 0) {
        if ((int)uVar14 <= (int)uVar18) {
LAB_00521339:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecBit.h"
                        ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
        }
        puVar1 = (uint *)((long)__s_01 + (ulong)(uVar18 >> 5) * 4);
        *puVar1 = *puVar1 | 1 << ((byte)uVar18 & 0x1f);
      }
      uVar18 = uVar18 + 1;
    } while (uVar22 != uVar18);
  }
  p_00 = Gia_ManStart(10000);
  __s = p->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar25 = strlen(__s);
    __dest = (char *)malloc(sVar25 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  iVar24 = p->nRegs;
  if (0 < iVar24) {
    iVar8 = 0;
    do {
      iVar10 = p->vCis->nSize;
      uVar22 = (iVar10 - iVar24) + iVar8;
      if (((int)uVar22 < 0) || (iVar10 <= (int)uVar22)) goto LAB_00521241;
      iVar24 = p->vCis->pArray[uVar22];
      if ((iVar24 < 0) || (p->nObjs <= iVar24)) goto LAB_00521222;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar6 = Gia_ManAppendObj(p_00);
      uVar11 = *(ulong *)pGVar6;
      *(ulong *)pGVar6 = uVar11 | 0x9fffffff;
      *(ulong *)pGVar6 =
           uVar11 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar3 = p_00->pObjs;
      if ((pGVar6 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar6)) {
LAB_0052129e:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar3) >> 2) * -0x55555555);
      if ((pGVar6 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar6)) goto LAB_0052129e;
      iVar8 = iVar8 + 1;
      iVar24 = p->nRegs;
    } while (iVar8 < iVar24);
  }
  Gia_ManHashStart(p_00);
  pGVar3 = p->pObjs;
  pGVar3->Value = 1;
  pVVar12 = p->vCis;
  uVar22 = pVVar12->nSize;
  uVar18 = uVar22 - p->nRegs;
  if (uVar18 != 0 && p->nRegs <= (int)uVar22) {
    uVar17 = 0;
    uVar11 = (ulong)uVar22;
    if ((int)uVar22 < 1) {
      uVar11 = uVar17;
    }
    do {
      if (uVar11 == uVar17) goto LAB_00521241;
      iVar24 = pVVar12->pArray[uVar17];
      if (((long)iVar24 < 0) || (p->nObjs <= iVar24)) goto LAB_00521222;
      pGVar3[iVar24].Value = 1;
      uVar17 = uVar17 + 1;
    } while (uVar18 != uVar17);
  }
  if (iFrEnd <= pCex->iFrame) {
    iVar24 = iFrEnd;
    if ((int)uVar14 < 1) {
      uVar14 = 0;
    }
    do {
      uVar11 = (ulong)(uint)p->nRegs;
      if (0 < p->nRegs) {
        uVar22 = 0;
        do {
          iVar8 = p->vCis->nSize;
          uVar18 = (iVar8 - (int)uVar11) + uVar22;
          if (((int)uVar18 < 0) || (iVar8 <= (int)uVar18)) goto LAB_00521241;
          iVar8 = p->vCis->pArray[uVar18];
          if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_00521222;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          if (uVar14 == uVar22) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecBit.h"
                          ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
          }
          pGVar3 = p->pObjs + iVar8;
          *(ulong *)pGVar3 =
               *(ulong *)pGVar3 & 0xffffffffbfffffff |
               (ulong)((*(uint *)((long)__s_01 + (ulong)(uVar22 >> 5) * 4) >> ((byte)uVar22 & 0x1f)
                       & 1) << 0x1e);
          uVar22 = uVar22 + 1;
          uVar11 = (ulong)(uint)p->nRegs;
        } while ((int)uVar22 < p->nRegs);
      }
      local_68 = local_58;
      iVar8 = iFrEnd;
      if (iFrEnd < iVar24) {
        do {
          pVVar12 = p->vCis;
          uVar17 = (ulong)(uint)pVVar12->nSize;
          if ((int)uVar11 < pVVar12->nSize) {
            lVar16 = 0;
            do {
              if ((int)uVar17 <= lVar16) goto LAB_00521241;
              lVar23 = (long)pVVar12->pArray[lVar16];
              if ((lVar23 < 0) || (iVar10 = p->nObjs, iVar10 <= pVVar12->pArray[lVar16]))
              goto LAB_00521222;
              pGVar3 = p->pObjs;
              if (pGVar3 == (Gia_Obj_t *)0x0) {
                local_68 = local_68 + (int)lVar16;
                goto LAB_00520ab9;
              }
              *(ulong *)(pGVar3 + lVar23) =
                   *(ulong *)(pGVar3 + lVar23) & 0xffffffffbfffffff |
                   (ulong)(((uint)(&pCex[1].iPo)[(int)((ulong)local_68 + lVar16) >> 5] >>
                            ((byte)((ulong)local_68 + lVar16) & 0x1f) & 1) << 0x1e);
              lVar16 = lVar16 + 1;
              pVVar12 = p->vCis;
              uVar17 = (ulong)pVVar12->nSize;
            } while (lVar16 < (long)(uVar17 - (long)p->nRegs));
            local_68 = local_68 + (int)lVar16;
          }
          iVar10 = p->nObjs;
          if (0 < iVar10) {
LAB_00520ab9:
            lVar16 = 0;
            lVar23 = 0;
            do {
              pGVar3 = p->pObjs;
              if (pGVar3 == (Gia_Obj_t *)0x0) break;
              uVar11 = *(ulong *)(&pGVar3->field_0x0 + lVar16);
              if ((uVar11 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar11) {
                *(ulong *)(&pGVar3->field_0x0 + lVar16) =
                     uVar11 & 0xffffffff3fffffff |
                     (ulong)((((uint)(uVar11 >> 0x3d) ^
                              *(uint *)((long)pGVar3 +
                                       (ulong)((uint)(uVar11 >> 0x1e) & 0x7ffffffc) * -3 + lVar16)
                              >> 0x1e) &
                              ((uint)(uVar11 >> 0x1d) & 7 ^
                              *(uint *)((long)pGVar3 +
                                       (ulong)(uint)((int)(uVar11 & 0x1fffffff) << 2) * -3 + lVar16)
                              >> 0x1e) & 1) << 0x1e);
                iVar10 = p->nObjs;
              }
              lVar23 = lVar23 + 1;
              lVar16 = lVar16 + 0xc;
            } while (lVar23 < iVar10);
          }
          pVVar12 = p->vCos;
          if (0 < pVVar12->nSize) {
            lVar16 = 0;
            do {
              iVar10 = pVVar12->pArray[lVar16];
              if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) goto LAB_00521222;
              if (p->pObjs == (Gia_Obj_t *)0x0) break;
              pGVar3 = p->pObjs + iVar10;
              uVar22 = (uint)*(ulong *)pGVar3;
              *(ulong *)pGVar3 =
                   *(ulong *)pGVar3 & 0xffffffffbfffffff |
                   (ulong)((uVar22 * 2 ^ *(uint *)(pGVar3 + -(ulong)(uVar22 & 0x1fffffff))) &
                          0x40000000);
              lVar16 = lVar16 + 1;
              pVVar12 = p->vCos;
            } while (lVar16 < pVVar12->nSize);
          }
          uVar11 = (ulong)(uint)p->nRegs;
          if (0 < p->nRegs) {
            iVar10 = 0;
            do {
              iVar2 = p->vCos->nSize;
              uVar22 = (iVar2 - (int)uVar11) + iVar10;
              if (((int)uVar22 < 0) || (iVar2 <= (int)uVar22)) goto LAB_00521241;
              iVar2 = p->vCos->pArray[uVar22];
              if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_00521222;
              pGVar3 = p->pObjs;
              if (pGVar3 == (Gia_Obj_t *)0x0) break;
              iVar13 = p->vCis->nSize;
              uVar22 = (iVar13 - (int)uVar11) + iVar10;
              if (((int)uVar22 < 0) || (iVar13 <= (int)uVar22)) goto LAB_00521241;
              uVar22 = p->vCis->pArray[uVar22];
              lVar16 = (long)(int)uVar22;
              if ((lVar16 < 0) || ((uint)p->nObjs <= uVar22)) goto LAB_00521222;
              *(ulong *)(pGVar3 + lVar16) =
                   *(ulong *)(pGVar3 + lVar16) & 0xffffffffbfffffff |
                   (ulong)((uint)*(undefined8 *)(pGVar3 + iVar2) & 0x40000000);
              iVar10 = iVar10 + 1;
              uVar11 = (ulong)(uint)p->nRegs;
            } while (iVar10 < p->nRegs);
          }
          iVar8 = iVar8 + 1;
        } while (iVar8 != iVar24);
      }
      if (0 < (int)uVar11) {
        pVVar12 = p->vCis;
        iVar8 = pVVar12->nSize;
        uVar17 = (ulong)(uint)(iVar8 - (int)uVar11);
        uVar20 = 0;
        do {
          if (((int)uVar17 < 0) || (iVar8 <= (int)uVar17)) goto LAB_00521241;
          iVar10 = pVVar12->pArray[uVar17];
          if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) goto LAB_00521222;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          lVar16 = (long)p_00->vCis->nSize;
          if (lVar16 - p_00->nRegs <= (long)uVar20) {
            __assert_fail("v < Gia_ManPiNum(p)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1b2,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
          }
          if (lVar16 <= (long)uVar20) goto LAB_00521241;
          iVar2 = p_00->vCis->pArray[uVar20];
          if (((long)iVar2 < 0) || (p_00->nObjs <= iVar2)) goto LAB_00521222;
          pGVar3 = p_00->pObjs;
          pGVar6 = (Gia_Obj_t *)((ulong)(pGVar3 + iVar2) & 0xfffffffffffffffe);
          if ((pGVar6 < pGVar3) || (pGVar3 + (uint)p_00->nObjs <= pGVar6)) goto LAB_0052129e;
          iVar13 = (int)((ulong)((long)pGVar6 - (long)pGVar3) >> 2);
          if (iVar13 * -0x55555555 < 0) {
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf1,"int Abc_Var2Lit(int, int)");
          }
          pGVar6 = p->pObjs + iVar10;
          pGVar6->Value =
               (uint)((*(uint *)pGVar6 >> 0x1e & 1) == 0) ^
               ((uint)(pGVar3 + iVar2) & 1) + iVar13 * 0x55555556;
          uVar20 = uVar20 + 1;
          uVar17 = uVar17 + 1;
        } while (uVar11 != uVar20);
      }
      iVar8 = iVar24;
      if (iVar24 <= pCex->iFrame) {
        do {
          pVVar12 = p->vCis;
          uVar17 = (ulong)(uint)pVVar12->nSize;
          if ((int)uVar11 < pVVar12->nSize) {
            lVar16 = 0;
            do {
              if ((int)uVar17 <= lVar16) goto LAB_00521241;
              lVar23 = (long)pVVar12->pArray[lVar16];
              if ((lVar23 < 0) || (iVar10 = p->nObjs, iVar10 <= pVVar12->pArray[lVar16]))
              goto LAB_00521222;
              pGVar3 = p->pObjs;
              if (pGVar3 == (Gia_Obj_t *)0x0) {
                local_68 = local_68 + (int)lVar16;
                goto LAB_00520e89;
              }
              *(ulong *)(pGVar3 + lVar23) =
                   *(ulong *)(pGVar3 + lVar23) & 0xffffffffbfffffff |
                   (ulong)(((uint)(&pCex[1].iPo)[(int)((ulong)local_68 + lVar16) >> 5] >>
                            ((byte)((ulong)local_68 + lVar16) & 0x1f) & 1) << 0x1e);
              lVar16 = lVar16 + 1;
              pVVar12 = p->vCis;
              uVar17 = (ulong)pVVar12->nSize;
            } while (lVar16 < (long)(uVar17 - (long)p->nRegs));
            local_68 = local_68 + (int)lVar16;
          }
          iVar10 = p->nObjs;
          if (0 < iVar10) {
LAB_00520e89:
            lVar23 = 8;
            lVar16 = 0;
            do {
              pGVar3 = p->pObjs;
              if (pGVar3 == (Gia_Obj_t *)0x0) break;
              uVar11 = *(ulong *)((long)pGVar3 + lVar23 + -8);
              if ((uVar11 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar11) {
                uVar22 = (uint)(uVar11 & 0x1fffffff);
                uVar15 = (uint)(uVar11 >> 0x1d) & 7 ^
                         *(uint *)((long)pGVar3 + (ulong)(uVar22 * 4) * -3 + lVar23 + -8) >> 0x1e;
                uVar18 = (uint)(uVar11 >> 0x20);
                uVar9 = uVar18 & 0x1fffffff;
                uVar19 = *(uint *)((long)pGVar3 + (ulong)(uVar9 * 4) * -3 + lVar23 + -8) >> 0x1e & 1
                ;
                uVar18 = uVar18 >> 0x1d & 1;
                uVar21 = (uVar19 ^ uVar18) & uVar15;
                *(ulong *)((long)pGVar3 + lVar23 + -8) =
                     uVar11 & 0xffffffff3fffffff | (ulong)(uVar21 << 0x1e);
                if (uVar21 == 0) {
                  if (((uVar15 & 1) == 0) && (uVar19 == uVar18)) {
                    iVar10 = Gia_ManHashOr(p_00,*(int *)((long)pGVar3 +
                                                        lVar23 + (ulong)(uVar22 << 2) * -3),
                                           *(int *)((long)pGVar3 + lVar23 + (ulong)(uVar9 << 2) * -3
                                                   ));
                  }
                  else {
                    if (((uVar15 & 1) != 0) && (uVar22 = uVar9, uVar19 != uVar18)) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexCut.c"
                                    ,0x144,
                                    "Gia_Man_t *Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                                   );
                    }
                    iVar10 = *(int *)((long)pGVar3 + lVar23 + (ulong)(uVar22 << 2) * -3);
                  }
                }
                else {
                  iVar10 = Gia_ManHashAnd(p_00,*(int *)((long)pGVar3 +
                                                       lVar23 + (ulong)(uVar22 << 2) * -3),
                                          *(int *)((long)pGVar3 + lVar23 + (ulong)(uVar9 << 2) * -3)
                                         );
                }
                *(int *)(&pGVar3->field_0x0 + lVar23) = iVar10;
                if (iVar10 == 0) {
                  __assert_fail("pObj->Value > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexCut.c"
                                ,0x145,
                                "Gia_Man_t *Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                               );
                }
                iVar10 = p->nObjs;
              }
              lVar16 = lVar16 + 1;
              lVar23 = lVar23 + 0xc;
            } while (lVar16 < iVar10);
          }
          pVVar12 = p->vCos;
          if (0 < pVVar12->nSize) {
            lVar16 = 0;
            do {
              iVar10 = pVVar12->pArray[lVar16];
              if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) goto LAB_00521222;
              if (p->pObjs == (Gia_Obj_t *)0x0) break;
              pGVar3 = p->pObjs + iVar10;
              uVar22 = (uint)*(ulong *)pGVar3;
              uVar11 = (ulong)(uVar22 & 0x1fffffff);
              *(ulong *)pGVar3 =
                   *(ulong *)pGVar3 & 0xffffffffbfffffff |
                   (ulong)((uVar22 * 2 ^ *(uint *)(pGVar3 + -uVar11)) & 0x40000000);
              uVar22 = pGVar3[-uVar11].Value;
              pGVar3->Value = uVar22;
              if (uVar22 == 0) {
                __assert_fail("pObj->Value > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexCut.c"
                              ,0x14b,
                              "Gia_Man_t *Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                             );
              }
              lVar16 = lVar16 + 1;
              pVVar12 = p->vCos;
            } while (lVar16 < pVVar12->nSize);
          }
          iVar10 = pCex->iFrame;
          if (iVar8 == iVar10) break;
          uVar11 = (ulong)(uint)p->nRegs;
          if (0 < p->nRegs) {
            iVar10 = 0;
            do {
              iVar2 = p->vCos->nSize;
              uVar22 = (iVar2 - (int)uVar11) + iVar10;
              if (((int)uVar22 < 0) || (iVar2 <= (int)uVar22)) goto LAB_00521241;
              iVar2 = p->vCos->pArray[uVar22];
              if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_00521222;
              pGVar3 = p->pObjs;
              if (pGVar3 == (Gia_Obj_t *)0x0) break;
              iVar13 = p->vCis->nSize;
              uVar22 = (iVar13 - (int)uVar11) + iVar10;
              if (((int)uVar22 < 0) || (iVar13 <= (int)uVar22)) goto LAB_00521241;
              uVar22 = p->vCis->pArray[uVar22];
              lVar16 = (long)(int)uVar22;
              if ((lVar16 < 0) || ((uint)p->nObjs <= uVar22)) goto LAB_00521222;
              *(ulong *)(pGVar3 + lVar16) =
                   *(ulong *)(pGVar3 + lVar16) & 0xffffffffbfffffff |
                   (ulong)((uint)*(undefined8 *)(pGVar3 + iVar2) & 0x40000000);
              pGVar3[lVar16].Value = pGVar3[iVar2].Value;
              iVar10 = iVar10 + 1;
              uVar11 = (ulong)(uint)p->nRegs;
            } while (iVar10 < p->nRegs);
            iVar10 = pCex->iFrame;
          }
          bVar4 = iVar8 < iVar10;
          iVar8 = iVar8 + 1;
        } while (bVar4);
      }
      if (local_68 != pCex->nBits) {
        __assert_fail("iBit == pCex->nBits",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexCut.c"
                      ,0x155,
                      "Gia_Man_t *Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                     );
      }
      uVar22 = pCex->iPo;
      iVar8 = p->vCos->nSize;
      if (iVar8 - p->nRegs <= (int)uVar22) {
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b3,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if (((int)uVar22 < 0) || (iVar8 <= (int)uVar22)) {
LAB_00521241:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar8 = p->vCos->pArray[uVar22];
      if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) {
LAB_00521222:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      Gia_ManAppendCo(p_00,p->pObjs[iVar8].Value);
      bVar4 = iVar24 < pCex->iFrame;
      iVar24 = iVar24 + 1;
    } while (bVar4);
  }
  Gia_ManHashStop(p_00);
  if (__s_01 != (void *)0x0) {
    free(__s_01);
  }
  pGVar7 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar7;
}

Assistant:

Gia_Man_t * Bmc_GiaGenerateGiaAllFrames( Gia_Man_t * p, Abc_Cex_t * pCex, Vec_Bit_t ** pvInits, int iFrBeg, int iFrEnd )
{
    Vec_Bit_t * vInitEnd;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    int f, i, k, iBitOld, iBit = 0, fCompl0, fCompl1;

    // skip trough the first iFrEnd frames
    Gia_ManCleanMark0(p);
    Gia_ManForEachRo( p, pObj, k )
        pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
    *pvInits = Vec_BitStart( Gia_ManRegNum(p) );
    for ( i = 0; i < iFrEnd; i++ )
    {
        // remember values in frame iFrBeg
        if ( i == iFrBeg )
            Gia_ManForEachRo( p, pObjRo, k )
                if ( pObjRo->fMark0 )
                    Vec_BitWriteEntry( *pvInits, k, 1 );
        // simulate other values
        Gia_ManForEachPi( p, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
        Gia_ManForEachAnd( p, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                           (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( p, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            pObjRo->fMark0 = pObjRi->fMark0;
    }
    assert( i == iFrEnd );
    vInitEnd = Vec_BitStart( Gia_ManRegNum(p) );
    Gia_ManForEachRo( p, pObjRo, k )
        if ( pObjRo->fMark0 )
            Vec_BitWriteEntry( vInitEnd, k, 1 );

    // create new AIG manager
    pNew = Gia_ManStart( 10000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManForEachRo( p, pObjRo, k )
        Gia_ManAppendCi(pNew);
    Gia_ManHashStart( pNew );

    Gia_ManConst0(p)->Value = 1;
    Gia_ManForEachPi( p, pObj, k )
        pObj->Value = 1;

    iBitOld = iBit;
    for ( f = iFrEnd; f <= pCex->iFrame; f++ )
    {
        // set up correct init state
        Gia_ManForEachRo( p, pObjRo, k )
            pObjRo->fMark0 = Vec_BitEntry( vInitEnd, k );
        // simulate it for a few frames
        iBit = iBitOld;
        for ( i = iFrEnd; i < f; i++ )
        {
            Gia_ManForEachPi( p, pObj, k )
                pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
            Gia_ManForEachAnd( p, pObj, k )
                pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                               (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
            Gia_ManForEachCo( p, pObj, k )
                pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
                pObjRo->fMark0 = pObjRi->fMark0;
        }
        // start creating values
        Gia_ManForEachRo( p, pObjRo, k )
            pObjRo->Value = Abc_LitNotCond( Gia_Obj2Lit(pNew, Gia_ManPi(pNew, k)), !pObjRo->fMark0 );
        for ( i = f; i <= pCex->iFrame; i++ )
        {
            Gia_ManForEachPi( p, pObj, k )
                pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
            Gia_ManForEachAnd( p, pObj, k )
            {
                fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
                fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
                pObj->fMark0 = fCompl0 & fCompl1;
                if ( pObj->fMark0 )
                    pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
                else if ( !fCompl0 && !fCompl1 )
                    pObj->Value = Gia_ManHashOr( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
                else if ( !fCompl0 )
                    pObj->Value = Gia_ObjFanin0(pObj)->Value;
                else if ( !fCompl1 )
                    pObj->Value = Gia_ObjFanin1(pObj)->Value;
                else assert( 0 );
                assert( pObj->Value > 0 );
            }
            Gia_ManForEachCo( p, pObj, k )
            {
                pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
                pObj->Value = Gia_ObjFanin0(pObj)->Value;
                assert( pObj->Value > 0 );
            } 
            if ( i == pCex->iFrame )
                break;
            Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            {
                pObjRo->fMark0 = pObjRi->fMark0;
                pObjRo->Value = pObjRi->Value;
            }
        }
        assert( iBit == pCex->nBits );
        // create PO
        Gia_ManAppendCo( pNew, Gia_ManPo(p, pCex->iPo)->Value );
    }
    Gia_ManHashStop( pNew );
    Vec_BitFree( vInitEnd );

    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}